

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

int MpiGetPriority(CP_Services Svcs,void *CP_Stream,_SstParams *Params)

{
  uint in_EAX;
  uint uVar1;
  char *pcVar2;
  int Provided;
  int IsInitialized;
  
  _Provided = (ulong)in_EAX;
  MPI_Initialized(&IsInitialized);
  if (IsInitialized == 0) {
    pcVar2 = strdup("MPI_Initialized() failed");
    uVar1 = 0xffffffff;
  }
  else {
    _Provided = (ulong)(uint)IsInitialized << 0x20;
    MPI_Query_thread(&Provided);
    pcVar2 = "Heuristics determined poor compatibility";
    if (Provided != 3) {
      pcVar2 = "MPI_THREAD_MULTIPLE not supported by MPI";
    }
    uVar1 = -(uint)(Provided != 3);
    pcVar2 = strdup(pcVar2);
  }
  (*Svcs->verbose)(CP_Stream,2,"mpi_dp priority=%d since: %s.",(ulong)uVar1,pcVar2);
  free(pcVar2);
  return uVar1;
}

Assistant:

static int MpiGetPriority(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params)
{
    char *ReasonMsg = NULL;
    int ReturnValue = 10;
    int IsInitialized = 0;
    MPI_Initialized(&IsInitialized);
    if (IsInitialized)
    {
        int Provided = 0;
        MPI_Query_thread(&Provided);
        if (Provided == MPI_THREAD_MULTIPLE)
        {
#if defined(ADIOS2_SST_HAVE_MPI_DP_HEURISTICS_PASSED)
            ReasonMsg = strdup("Heuristics determined good compatibility");
            ReturnValue = 10;
#else
            ReasonMsg = strdup("Heuristics determined poor compatibility");
            ReturnValue = 0;
#endif
        }
        else
        {
            ReasonMsg = strdup("MPI_THREAD_MULTIPLE not supported by MPI");
            ReturnValue = -1;
        }
    }
    else
    {
        ReasonMsg = strdup("MPI_Initialized() failed");
        ReturnValue = -1;
    }

    Svcs->verbose(CP_Stream, DPSummaryVerbose, "mpi_dp priority=%d since: %s.", ReturnValue,
                  ReasonMsg);

    free(ReasonMsg);

    return ReturnValue;
}